

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SetupPrefixIter(Fts5Index *p,int bDesc,u8 *pToken,int nToken,Fts5Colset *pColset,
                        Fts5Iter **ppIter)

{
  void *__s2;
  int iVar1;
  long lVar2;
  u8 *pTerm;
  int nTerm;
  Fts5SegIter *pSeg;
  undefined1 auStack_90 [4];
  int bNewTerm;
  Fts5Buffer doclist;
  Fts5Data *pData;
  Fts5Iter *p1;
  i64 iLastRowid;
  int i;
  int flags;
  _func_void_Fts5Index_ptr_i64_Fts5Iter_ptr_Fts5Buffer_ptr *xAppend;
  _func_void_Fts5Index_ptr_Fts5Buffer_ptr_Fts5Buffer_ptr *xMerge;
  void *pvStack_48;
  int nBuf;
  Fts5Buffer *aBuf;
  Fts5Structure *pStruct;
  Fts5Iter **ppIter_local;
  Fts5Colset *pColset_local;
  u8 *puStack_20;
  int nToken_local;
  u8 *pToken_local;
  Fts5Index *pFStack_10;
  int bDesc_local;
  Fts5Index *p_local;
  
  xMerge._4_4_ = 0x20;
  if (p->pConfig->eDetail == 1) {
    xAppend = fts5MergeRowidLists;
    _i = fts5AppendRowid;
  }
  else {
    xAppend = fts5MergePrefixLists;
    _i = fts5AppendPoslist;
  }
  pStruct = (Fts5Structure *)ppIter;
  ppIter_local = (Fts5Iter **)pColset;
  pColset_local._4_4_ = nToken;
  puStack_20 = pToken;
  pToken_local._4_4_ = bDesc;
  pFStack_10 = p;
  pvStack_48 = fts5IdxMalloc(p,0x200);
  aBuf = (Fts5Buffer *)fts5StructureRead(pFStack_10);
  if ((pvStack_48 != (void *)0x0) && ((Fts5Structure *)aBuf != (Fts5Structure *)0x0)) {
    iLastRowid._4_4_ = 0x38;
    p1 = (Fts5Iter *)0x0;
    pData = (Fts5Data *)0x0;
    pSeg._4_4_ = 1;
    memset(auStack_90,0,0x10);
    fts5MultiIterNew(pFStack_10,(Fts5Structure *)aBuf,0x38,(Fts5Colset *)ppIter_local,puStack_20,
                     pColset_local._4_4_,-1,0,(Fts5Iter **)&pData);
    fts5IterSetOutputCb(&pFStack_10->rc,(Fts5Iter *)pData);
    while (iVar1 = fts5MultiIterEof(pFStack_10,(Fts5Iter *)pData), iVar1 == 0) {
      lVar2 = (long)pData + (ulong)*(ushort *)(*(long *)&pData[5].nn + 4) * 0x78 + 0x60;
      iVar1 = *(int *)(lVar2 + 0x60);
      __s2 = *(void **)(lVar2 + 0x58);
      (**(code **)&pData[3].nn)(pData,lVar2);
      if ((pSeg._4_4_ != 0) &&
         ((iVar1 < pColset_local._4_4_ ||
          (iVar1 = memcmp(puStack_20,__s2,(long)pColset_local._4_4_), iVar1 != 0)))) break;
      if (*(int *)&pData[1].p != 0) {
        if (((long)pData->p <= (long)p1) && (0 < (int)doclist.p)) {
          iLastRowid._0_4_ = 0;
          while (pFStack_10->rc == 0 && (int)doclist.p != 0) {
            if (*(int *)((long)pvStack_48 + (long)(int)iLastRowid * 0x10 + 8) == 0) {
              fts5BufferSwap((Fts5Buffer *)auStack_90,
                             (Fts5Buffer *)((long)pvStack_48 + (long)(int)iLastRowid * 0x10));
              sqlite3Fts5BufferZero((Fts5Buffer *)auStack_90);
            }
            else {
              (*xAppend)(pFStack_10,(i64)auStack_90,
                         (Fts5Iter *)((long)pvStack_48 + (long)(int)iLastRowid * 0x10),
                         (Fts5Buffer *)((long)(int)iLastRowid * 0x10));
              sqlite3Fts5BufferZero((Fts5Buffer *)((long)pvStack_48 + (long)(int)iLastRowid * 0x10))
              ;
            }
            iLastRowid._0_4_ = (int)iLastRowid + 1;
          }
          p1 = (Fts5Iter *)0x0;
        }
        (*_i)(pFStack_10,(long)pData->p - (long)p1,pData,auStack_90);
        p1 = (Fts5Iter *)pData->p;
      }
      fts5MultiIterNext2(pFStack_10,(Fts5Iter *)pData,(int *)((long)&pSeg + 4));
    }
    for (iLastRowid._0_4_ = 0; (int)iLastRowid < 0x20; iLastRowid._0_4_ = (int)iLastRowid + 1) {
      if (pFStack_10->rc == 0) {
        (*xAppend)(pFStack_10,(i64)auStack_90,
                   (Fts5Iter *)((long)pvStack_48 + (long)(int)iLastRowid * 0x10),
                   (Fts5Buffer *)((long)(int)iLastRowid * 0x10));
      }
      sqlite3Fts5BufferFree((Fts5Buffer *)((long)pvStack_48 + (long)(int)iLastRowid * 0x10));
    }
    fts5MultiIterFree((Fts5Iter *)pData);
    doclist._8_8_ = fts5IdxMalloc(pFStack_10,(long)(int)doclist.p + 0x18);
    if ((undefined8 *)doclist._8_8_ != (undefined8 *)0x0) {
      *(undefined8 **)doclist._8_8_ = (undefined8 *)(doclist._8_8_ + 0x10);
      *(int *)(doclist._8_8_ + 0xc) = (int)doclist.p;
      *(int *)(doclist._8_8_ + 8) = (int)doclist.p;
      if ((int)doclist.p != 0) {
        memcpy(*(void **)doclist._8_8_,_auStack_90,(long)(int)doclist.p);
      }
      fts5MultiIterNew2(pFStack_10,(Fts5Data *)doclist._8_8_,pToken_local._4_4_,(Fts5Iter **)pStruct
                       );
    }
    sqlite3Fts5BufferFree((Fts5Buffer *)auStack_90);
  }
  fts5StructureRelease((Fts5Structure *)aBuf);
  sqlite3_free(pvStack_48);
  return;
}

Assistant:

static void fts5SetupPrefixIter(
  Fts5Index *p,                   /* Index to read from */
  int bDesc,                      /* True for "ORDER BY rowid DESC" */
  const u8 *pToken,               /* Buffer containing prefix to match */
  int nToken,                     /* Size of buffer pToken in bytes */
  Fts5Colset *pColset,            /* Restrict matches to these columns */
  Fts5Iter **ppIter          /* OUT: New iterator */
){
  Fts5Structure *pStruct;
  Fts5Buffer *aBuf;
  const int nBuf = 32;

  void (*xMerge)(Fts5Index*, Fts5Buffer*, Fts5Buffer*);
  void (*xAppend)(Fts5Index*, i64, Fts5Iter*, Fts5Buffer*);
  if( p->pConfig->eDetail==FTS5_DETAIL_NONE ){
    xMerge = fts5MergeRowidLists;
    xAppend = fts5AppendRowid;
  }else{
    xMerge = fts5MergePrefixLists;
    xAppend = fts5AppendPoslist;
  }

  aBuf = (Fts5Buffer*)fts5IdxMalloc(p, sizeof(Fts5Buffer)*nBuf);
  pStruct = fts5StructureRead(p);

  if( aBuf && pStruct ){
    const int flags = FTS5INDEX_QUERY_SCAN 
                    | FTS5INDEX_QUERY_SKIPEMPTY 
                    | FTS5INDEX_QUERY_NOOUTPUT;
    int i;
    i64 iLastRowid = 0;
    Fts5Iter *p1 = 0;     /* Iterator used to gather data from index */
    Fts5Data *pData;
    Fts5Buffer doclist;
    int bNewTerm = 1;

    memset(&doclist, 0, sizeof(doclist));
    fts5MultiIterNew(p, pStruct, flags, pColset, pToken, nToken, -1, 0, &p1);
    fts5IterSetOutputCb(&p->rc, p1);
    for( /* no-op */ ;
        fts5MultiIterEof(p, p1)==0;
        fts5MultiIterNext2(p, p1, &bNewTerm)
    ){
      Fts5SegIter *pSeg = &p1->aSeg[ p1->aFirst[1].iFirst ];
      int nTerm = pSeg->term.n;
      const u8 *pTerm = pSeg->term.p;
      p1->xSetOutputs(p1, pSeg);

      assert_nc( memcmp(pToken, pTerm, MIN(nToken, nTerm))<=0 );
      if( bNewTerm ){
        if( nTerm<nToken || memcmp(pToken, pTerm, nToken) ) break;
      }

      if( p1->base.nData==0 ) continue;

      if( p1->base.iRowid<=iLastRowid && doclist.n>0 ){
        for(i=0; p->rc==SQLITE_OK && doclist.n; i++){
          assert( i<nBuf );
          if( aBuf[i].n==0 ){
            fts5BufferSwap(&doclist, &aBuf[i]);
            fts5BufferZero(&doclist);
          }else{
            xMerge(p, &doclist, &aBuf[i]);
            fts5BufferZero(&aBuf[i]);
          }
        }
        iLastRowid = 0;
      }

      xAppend(p, p1->base.iRowid-iLastRowid, p1, &doclist);
      iLastRowid = p1->base.iRowid;
    }

    for(i=0; i<nBuf; i++){
      if( p->rc==SQLITE_OK ){
        xMerge(p, &doclist, &aBuf[i]);
      }
      fts5BufferFree(&aBuf[i]);
    }
    fts5MultiIterFree(p1);

    pData = fts5IdxMalloc(p, sizeof(Fts5Data)+doclist.n+FTS5_DATA_ZERO_PADDING);
    if( pData ){
      pData->p = (u8*)&pData[1];
      pData->nn = pData->szLeaf = doclist.n;
      if( doclist.n ) memcpy(pData->p, doclist.p, doclist.n);
      fts5MultiIterNew2(p, pData, bDesc, ppIter);
    }
    fts5BufferFree(&doclist);
  }

  fts5StructureRelease(pStruct);
  sqlite3_free(aBuf);
}